

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::commitTexturePage
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *this_00;
  uint uVar1;
  int iVar2;
  GLenum GVar3;
  ostream *poVar4;
  TestError *this_01;
  GLint height;
  GLint width;
  GLuint *local_40;
  uint local_34;
  
  this_00 = &this->field_0x88;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Commit Region [level: ",0x16);
  poVar4 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] - ",4);
  if ((this->mState).levels + -1 < level) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
               ,0x839);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
                    (this,(ulong)(uint)target,level);
  if (((char)iVar2 != '\0') &&
     (iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
                        (this,(ulong)(uint)target,level), (char)iVar2 != '\0')) {
    SparseTextureUtils::getTextureLevelSize
              (target,&this->mState,level,&width,&height,(GLint *)&local_34);
    uVar1 = local_34 * 6;
    if (target != 0x8513) {
      uVar1 = local_34;
    }
    local_40 = texture;
    (*gl->bindTexture)(target,*texture);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0xb5);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,gl,(ulong)(uint)target,(ulong)(uint)format,local_40,level,0,0,0,
               (ulong)(uint)(width / 2),(ulong)(uint)height,(ulong)uVar1,1);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"texPageCommitment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0x84e);
    return true;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Skip commitment [level: ",0x18);
  poVar4 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] - ",4);
  return false;
}

Assistant:

bool SparseTextureCommitmentTestCase::commitTexturePage(const Functions& gl, GLint target, GLint format,
														GLuint& texture, GLint level)
{
	mLog << "Commit Region [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	// Avoid not allowed commitments
	if (!isInPageSizesRange(target, level) || !isPageSizesMultiplication(target, level))
	{
		mLog << "Skip commitment [level: " << level << "] - ";
		return false;
	}

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	GLint widthCommitted = width / 2;

	Texture::Bind(gl, texture, target);
	texPageCommitment(gl, target, format, texture, level, 0, 0, 0, widthCommitted, height, depth, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texPageCommitment");

	return true;
}